

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O0

string_t duckdb::BinaryUhugeIntOperator::Operation<duckdb::uhugeint_t,duckdb::string_t>
                   (uhugeint_t input,Vector *result)

{
  hugeint_t value;
  char **output_00;
  string_t *this;
  Vector *in_RDX;
  uint64_t in_RSI;
  duckdb *in_RDI;
  idx_t in_R8;
  uhugeint_t in;
  uhugeint_t x;
  char *output;
  char *output_1;
  idx_t buffer_size;
  idx_t num_leading_zero;
  string_t target;
  string_t *in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  string_t *in_stack_ffffffffffffff90;
  uhugeint_t local_50;
  hugeint_t local_40;
  idx_t local_30;
  Vector *local_28;
  duckdb *local_20;
  uint64_t local_18;
  anon_union_16_2_67f50693_for_value local_10;
  
  in.upper = (uint64_t)in_RDX;
  in.lower = in_RSI;
  local_28 = in_RDX;
  local_20 = in_RDI;
  local_18 = in_RSI;
  local_50 = UnsafeNumericCast<duckdb::uhugeint_t,duckdb::uhugeint_t,void>(in_RDI,in);
  local_40 = duckdb::uhugeint_t::operator_cast_to_hugeint_t(&local_50);
  value.upper = in_stack_ffffffffffffff88;
  value.lower = (uint64_t)in_stack_ffffffffffffff80;
  local_30 = CountZeros<duckdb::hugeint_t>::Leading(value);
  output_00 = (char **)(0x80 - local_30);
  if (output_00 == (char **)0x0) {
    local_10 = (anon_union_16_2_67f50693_for_value)duckdb::StringVector::EmptyString(local_28,1);
    this = (string_t *)string_t::GetDataWriteable(in_stack_ffffffffffffff80);
    *(undefined1 *)&this->value = 0x30;
    string_t::Finalize(this);
  }
  else {
    local_10 = (anon_union_16_2_67f50693_for_value)
               duckdb::StringVector::EmptyString(local_28,(ulong)output_00);
    string_t::GetDataWriteable(in_stack_ffffffffffffff80);
    x.upper = (uint64_t)&stack0xffffffffffffff88;
    x.lower = local_18;
    WriteHugeIntBinBytes<duckdb::uhugeint_t>(local_20,x,output_00,in_R8);
    string_t::Finalize(in_stack_ffffffffffffff90);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto num_leading_zero = CountZeros<hugeint_t>::Leading(UnsafeNumericCast<uhugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 8 - num_leading_zero;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntBinBytes<uhugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}